

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR.cpp
# Opt level: O2

void __thiscall lr_grammar::GrammarLR::create_dfa_states(GrammarLR *this)

{
  vector<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_> *this_00;
  int iVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  int *piVar6;
  ulong uVar7;
  ulong uVar8;
  pointer pDVar9;
  ulong uVar10;
  int index;
  int i;
  ulong uVar11;
  pointer pDVar12;
  int i_1;
  ulong uVar13;
  vector<lr_grammar::Project,_std::allocator<lr_grammar::Project>_> projects;
  DFAState local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  projects.super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  projects.super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  projects.super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::operator+(&local_50,
                 &(((this->elements).
                    super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                    ._M_impl.super__Vector_impl_data._M_start)->super_Elem).name,"\'");
  local_78.projects.super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = find_name(this,&local_50);
  local_78.projects.super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>.
  _M_impl.super__Vector_impl_data._4_8_ = 0;
  std::vector<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>::
  emplace_back<lr_grammar::Project>(&projects,(Project *)&local_78);
  std::__cxx11::string::~string((string *)&local_50);
  closure(this,&projects);
  DFAState::DFAState(&local_78,&projects,0,
                     (int)(((long)(this->elements).
                                  super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->elements).
                                 super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x48));
  this_00 = &this->states;
  std::vector<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>::
  emplace_back<lr_grammar::DFAState>(this_00,&local_78);
  DFAState::~DFAState(&local_78);
  pDVar12 = (this->states).
            super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar10 = 0;
  do {
    if ((ulong)(((long)(this->states).
                       super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar12) / 0x28) <= uVar10
       ) {
      std::_Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>::~_Vector_base
                (&projects.
                  super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>);
      return;
    }
    for (uVar11 = 0;
        lVar5 = *(long *)&pDVar12[uVar10].projects.
                          super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>
                          ._M_impl,
        uVar11 < (ulong)(((long)*(pointer *)
                                 ((long)&pDVar12[uVar10].projects.
                                         super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>
                                         ._M_impl + 8) - lVar5) / 0xc); uVar11 = uVar11 + 1) {
      lVar4 = uVar11 * 0xc;
      iVar1 = *(int *)(lVar5 + 8 + lVar4);
      lVar2 = *(long *)&(this->elements).
                        super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                        ._M_impl.super__Vector_impl_data._M_start[*(int *)(lVar5 + lVar4)].
                        expression_of_set.
                        super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                        ._M_impl.super__Vector_impl_data;
      lVar5 = (long)*(int *)(lVar5 + 4 + lVar4) * 0x18;
      if (*(long *)(lVar2 + 8 + lVar5) - *(long *)(lVar2 + lVar5) >> 2 != (long)iVar1) {
        piVar6 = base_grammar::Express::operator[]((Express *)(lVar2 + lVar5),iVar1);
        iVar1 = *piVar6;
        pDVar12 = (this_00->
                  super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        if (pDVar12[uVar10].next[iVar1] == -1) {
          smove(this,pDVar12 + uVar10,iVar1,&projects);
          closure(this,&projects);
          pDVar12 = (this->states).
                    super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pDVar9 = (this->states).
                   super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          uVar7 = ((long)pDVar9 - (long)pDVar12) / 0x28;
          lVar5 = 0;
          for (uVar13 = 0; uVar8 = ((long)pDVar9 - (long)pDVar12) / 0x28, uVar13 < uVar8;
              uVar13 = uVar13 + 1) {
            bVar3 = DFAState::operator==
                              ((DFAState *)
                               ((long)&(pDVar12->projects).
                                       super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>
                                       ._M_impl + lVar5),&projects);
            pDVar12 = (this->states).
                      super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pDVar9 = (this->states).
                     super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (bVar3) {
              uVar8 = ((long)pDVar9 - (long)pDVar12) / 0x28;
              uVar7 = uVar13;
              break;
            }
            lVar5 = lVar5 + 0x28;
          }
          index = (int)uVar7;
          if (uVar8 == (long)index) {
            DFAState::DFAState(&local_78,&projects,index,
                               (int)(((long)(this->elements).
                                            super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->elements).
                                           super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                           ._M_impl.super__Vector_impl_data._M_start) / 0x48));
            std::vector<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>::
            emplace_back<lr_grammar::DFAState>(this_00,&local_78);
            DFAState::~DFAState(&local_78);
            pDVar12 = (this_00->
                      super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>
                      )._M_impl.super__Vector_impl_data._M_start;
          }
          pDVar12[uVar10].next[iVar1] = index;
        }
      }
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

void GrammarLR::create_dfa_states(){


    //开始计算,项目的点的下标是下一个
    //项目A->.abb 点的位置为0
    vector<Project> projects;
    projects.push_back(Project(find_name(elements[0].name + "'"), 0, 0));
    closure(projects);

    this->states.push_back(DFAState(projects, 0, elements.size()));


    //开始计算
    //S0是0下标，持续增长的
    for (int stateIndex = 0; stateIndex < this->states.size(); stateIndex++){

        //每一个状态的smove都要计算一下，针对是每一个项目集合，不用针对所有的元素
        for (int i = 0; i < states[stateIndex].projects.size(); i++){

            Project tmp = states[stateIndex].projects[i];

            //这是一个可移进后面没有smove了
            if (tmp.projectPoint == elements[tmp.elemKey].expression_of_set[tmp.expressIndex].expression.size()){
                continue;
            }
            //.后面的数的元素
            int elemIndex = elements[tmp.elemKey].expression_of_set[tmp.expressIndex][tmp.projectPoint];

            //先判断这个元素是不是已经计算了,不是-1已经计算了
            if (states[stateIndex].next[elemIndex] != -1) continue;

            //计算smove;
            smove(states[stateIndex], elemIndex, projects);

            //计算空闭包
            closure(projects);

            int countIndex = states.size();
            //看看这个状态是不是已经出现过了
            for (int i = 0; i < states.size(); i++){

                if (states[i] == projects){
                    countIndex = i;
                    break;
                }
            }

            //新状态，需要被push
            if (countIndex == states.size()){
                states.push_back(DFAState(projects, countIndex, elements.size()));
            }

            //给原来的状态进行调整
            states[stateIndex].next[elemIndex] = countIndex;

        }

    }


}